

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

void __thiscall CVmObjFixup::fix_dh(CVmObjFixup *this,char *dh)

{
  uint32_t tmp;
  vm_obj_id_t vVar1;
  
  if (*dh == '\x05') {
    vVar1 = get_new_id(this,*(vm_obj_id_t *)(dh + 1));
    if (vVar1 == 0) {
      *dh = '\x01';
    }
    else {
      *dh = '\x05';
      *(vm_obj_id_t *)(dh + 1) = vVar1;
    }
  }
  return;
}

Assistant:

void CVmObjFixup::fix_dh(VMG_ char *dh)
{
    /* if it's an object, translate the ID */
    if (vmb_get_dh_type(dh) == VM_OBJ)
    {
        vm_obj_id_t id;
        
        /* get the object value */
        id = vmb_get_dh_obj(dh);

        /* translate it */
        id = get_new_id(vmg_ id);
        
        /* 
         *   if it's invalid, set the dataholder value to nil; otherwise,
         *   set it to the new object ID 
         */
        if (id == VM_INVALID_OBJ)
            vmb_put_dh_nil(dh);
        else
            vmb_put_dh_obj(dh, id);
    }
}